

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5TokenizerModule * fts5LocateTokenizer(Fts5Global *pGlobal,char *zName)

{
  int iVar1;
  Fts5TokenizerModule *pFVar2;
  
  if (zName == (char *)0x0) {
    pFVar2 = pGlobal->pDfltTok;
  }
  else {
    for (pFVar2 = pGlobal->pTok; pFVar2 != (Fts5TokenizerModule *)0x0; pFVar2 = pFVar2->pNext) {
      if ((pFVar2->zName != (char *)0x0) &&
         (iVar1 = sqlite3StrICmp(zName,pFVar2->zName), iVar1 == 0)) {
        return pFVar2;
      }
    }
    pFVar2 = (Fts5TokenizerModule *)0x0;
  }
  return pFVar2;
}

Assistant:

static Fts5TokenizerModule *fts5LocateTokenizer(
  Fts5Global *pGlobal, 
  const char *zName
){
  Fts5TokenizerModule *pMod = 0;

  if( zName==0 ){
    pMod = pGlobal->pDfltTok;
  }else{
    for(pMod=pGlobal->pTok; pMod; pMod=pMod->pNext){
      if( sqlite3_stricmp(zName, pMod->zName)==0 ) break;
    }
  }

  return pMod;
}